

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::MatrixAccumulator::MatrixAccumulator(MatrixAccumulator *this)

{
  BaseAccumulator *in_RDI;
  
  in_RDI->_vptr_BaseAccumulator = (_func_int **)0x0;
  in_RDI->Count_ = 0;
  BaseAccumulator::BaseAccumulator(in_RDI);
  in_RDI->_vptr_BaseAccumulator = (_func_int **)&PTR_clear_00501c40;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x37edcb);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x37ede0);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x37edf8);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x37ee10);
  (**in_RDI->_vptr_BaseAccumulator)();
  return;
}

Assistant:

MatrixAccumulator() : BaseAccumulator() { this->clear(); }